

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O2

void __thiscall
BamTools::Variant::Variant<std::__cxx11::string>
          (Variant *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  size_t *psVar1;
  Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  this_00 = (Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x30);
  std::__cxx11::string::string((string *)&bStack_38,(string *)v);
  Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Impl
            (this_00,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  this->data = (ImplBase *)this_00;
  psVar1 = &(this_00->super_ImplBase).refs;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

Variant(T v)
        : data(new Impl<T>(v))
    {
        data->AddRef();
    }